

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_demo.cpp
# Opt level: O3

void __thiscall despot::RegDemo::PrintState(RegDemo *this,State *s,ostream *out)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  char buffer [20];
  char acStack_48 [24];
  
  uVar1 = (ulong)(uint)this->size_;
  if (0 < this->size_) {
    uVar3 = 0;
    do {
      if (uVar3 == (int)uVar1 - 1) {
        sVar2 = 6;
        if (uVar3 == *(uint *)(s + 0xc)) {
          pcVar4 = "T     ";
        }
        else {
          pcVar4 = "G     ";
        }
      }
      else if (uVar3 == *(uint *)(s + 0xc)) {
        sVar2 = 6;
        pcVar4 = "R     ";
      }
      else {
        sprintf(acStack_48,"%4.3f ",
                (this->trap_prob_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar3]);
        sVar2 = strlen(acStack_48);
        pcVar4 = acStack_48;
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar4,sVar2);
      uVar3 = uVar3 + 1;
      uVar1 = (ulong)this->size_;
    } while ((long)uVar3 < (long)uVar1);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  return;
}

Assistant:

void RegDemo::PrintState(const State& s, ostream& out) const {
	char buffer[20];
	for (int x = 0; x < size_; x++) {
		if (x == size_ - 1) {
			if (s.state_id == x)
				out << "T     ";
			else
				out << "G     ";
		} else {
			if (s.state_id == x)
				out << "R     ";
			else {
				sprintf(buffer, "%4.3f ", trap_prob_[x]);
				out << buffer;
			}
		}
	}
	out << endl;
}